

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymmetricKey.cpp
# Opt level: O2

ByteString * __thiscall
SymmetricKey::getKeyCheckValue(ByteString *__return_storage_ptr__,SymmetricKey *this)

{
  char cVar1;
  int iVar2;
  CryptoFactory *pCVar3;
  undefined4 extraout_var;
  long *plVar4;
  
  ByteString::ByteString(__return_storage_ptr__);
  pCVar3 = CryptoFactory::i();
  iVar2 = (*pCVar3->_vptr_CryptoFactory[4])(pCVar3,2);
  plVar4 = (long *)CONCAT44(extraout_var,iVar2);
  if (plVar4 != (long *)0x0) {
    cVar1 = (**(code **)(*plVar4 + 0x10))(plVar4);
    if (((cVar1 != '\0') &&
        (cVar1 = (**(code **)(*plVar4 + 0x18))(plVar4,&this->keyData), cVar1 != '\0')) &&
       (cVar1 = (**(code **)(*plVar4 + 0x20))(plVar4,__return_storage_ptr__), cVar1 != '\0')) {
      pCVar3 = CryptoFactory::i();
      (*pCVar3->_vptr_CryptoFactory[5])(pCVar3,plVar4);
      ByteString::resize(__return_storage_ptr__,3);
      return __return_storage_ptr__;
    }
    pCVar3 = CryptoFactory::i();
    (*pCVar3->_vptr_CryptoFactory[5])(pCVar3,plVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteString SymmetricKey::getKeyCheckValue() const
{
	ByteString digest;

	HashAlgorithm* hash = CryptoFactory::i()->getHashAlgorithm(HashAlgo::SHA1);
	if (hash == NULL) return digest;

	if (!hash->hashInit() ||
	    !hash->hashUpdate(keyData) ||
	    !hash->hashFinal(digest))
	{
		CryptoFactory::i()->recycleHashAlgorithm(hash);
		return digest;
	}
	CryptoFactory::i()->recycleHashAlgorithm(hash);

	digest.resize(3);

	return digest;
}